

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::dumpTokens(yaml *this,StringRef Input,raw_ostream *OS)

{
  raw_ostream *this_00;
  size_t sVar1;
  char *pcVar2;
  char cVar3;
  StringRef Input_00;
  StringRef Str;
  StringRef Str_00;
  Token T;
  SourceMgr SM;
  Scanner scanner;
  Token local_210;
  SourceMgr local_1d8;
  Scanner local_190;
  
  local_1d8.DiagHandler = (DiagHandlerTy)0x0;
  local_1d8.DiagContext = (void *)0x0;
  local_1d8.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Input_00.Length = (size_t)Input.Data;
  Input_00.Data = (char *)this;
  Scanner::Scanner(&local_190,Input_00,&local_1d8,true,(error_code *)0x0);
  do {
    Scanner::getNext(&local_210,&local_190);
    switch(local_210.Kind) {
    case TK_StreamStart:
      sVar1 = 0xe;
      pcVar2 = "Stream-Start: ";
      break;
    case TK_StreamEnd:
      sVar1 = 0xc;
      pcVar2 = "Stream-End: ";
      break;
    case TK_VersionDirective:
      sVar1 = 0x13;
      pcVar2 = "Version-Directive: ";
      break;
    case TK_TagDirective:
      sVar1 = 0xf;
      pcVar2 = "Tag-Directive: ";
      break;
    case TK_DocumentStart:
      sVar1 = 0x10;
      pcVar2 = "Document-Start: ";
      break;
    case TK_DocumentEnd:
      sVar1 = 0xe;
      pcVar2 = "Document-End: ";
      break;
    case TK_BlockEntry:
      sVar1 = 0xd;
      pcVar2 = "Block-Entry: ";
      break;
    case TK_BlockEnd:
      sVar1 = 0xb;
      pcVar2 = "Block-End: ";
      break;
    case TK_BlockSequenceStart:
      sVar1 = 0x16;
      pcVar2 = "Block-Sequence-Start: ";
      break;
    case TK_BlockMappingStart:
      sVar1 = 0x15;
      pcVar2 = "Block-Mapping-Start: ";
      break;
    case TK_FlowEntry:
      sVar1 = 0xc;
      pcVar2 = "Flow-Entry: ";
      break;
    case TK_FlowSequenceStart:
      sVar1 = 0x15;
      pcVar2 = "Flow-Sequence-Start: ";
      break;
    case TK_FlowSequenceEnd:
      sVar1 = 0x13;
      pcVar2 = "Flow-Sequence-End: ";
      break;
    case TK_FlowMappingStart:
      sVar1 = 0x14;
      pcVar2 = "Flow-Mapping-Start: ";
      break;
    case TK_FlowMappingEnd:
      sVar1 = 0x12;
      pcVar2 = "Flow-Mapping-End: ";
      break;
    case TK_Key:
      sVar1 = 5;
      pcVar2 = "Key: ";
      break;
    case TK_Value:
      sVar1 = 7;
      pcVar2 = "Value: ";
      break;
    case TK_Scalar:
      sVar1 = 8;
      pcVar2 = "Scalar: ";
      break;
    case TK_BlockScalar:
      sVar1 = 0xe;
      pcVar2 = "Block Scalar: ";
      break;
    case TK_Alias:
      sVar1 = 7;
      pcVar2 = "Alias: ";
      break;
    case TK_Anchor:
      sVar1 = 8;
      pcVar2 = "Anchor: ";
      break;
    case TK_Tag:
      sVar1 = 5;
      pcVar2 = "Tag: ";
      break;
    default:
      goto switchD_0016965e_default;
    }
    Str.Length = sVar1;
    Str.Data = pcVar2;
    raw_ostream::operator<<((raw_ostream *)Input.Length,Str);
switchD_0016965e_default:
    this_00 = raw_ostream::operator<<((raw_ostream *)Input.Length,local_210.Range);
    Str_00.Length = 1;
    Str_00.Data = "\n";
    raw_ostream::operator<<(this_00,Str_00);
    cVar3 = local_210.Kind == TK_Error;
    if (local_210.Kind == TK_StreamEnd) {
      cVar3 = '\x03';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.Value._M_dataplus._M_p != &local_210.Value.field_2) {
      operator_delete(local_210.Value._M_dataplus._M_p,
                      local_210.Value.field_2._M_allocated_capacity + 1);
    }
    if (cVar3 != '\0') {
      if ((SmallVectorStorage<(anonymous_namespace)::SimpleKey,_4U> *)
          local_190.SimpleKeys.super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
          super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
          super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
          super_SmallVectorBase.BeginX !=
          &local_190.SimpleKeys.super_SmallVectorStorage<(anonymous_namespace)::SimpleKey,_4U>) {
        free(local_190.SimpleKeys.super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
             super_SmallVectorBase.BeginX);
      }
      if ((SmallVectorStorage<int,_4U> *)
          local_190.Indents.super_SmallVectorImpl<int>.super_SmallVectorTemplateBase<int,_true>.
          super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX !=
          &local_190.Indents.super_SmallVectorStorage<int,_4U>) {
        free(local_190.Indents.super_SmallVectorImpl<int>.super_SmallVectorTemplateBase<int,_true>.
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX);
      }
      AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
      ::~AllocatorList(&local_190.TokenQueue);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d8.IncludeDirectories);
      std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::~vector
                (&local_1d8.Buffers);
      return cVar3 == '\x03';
    }
  } while( true );
}

Assistant:

bool yaml::dumpTokens(StringRef Input, raw_ostream &OS) {
  SourceMgr SM;
  Scanner scanner(Input, SM);
  while (true) {
    Token T = scanner.getNext();
    switch (T.Kind) {
    case Token::TK_StreamStart:
      OS << "Stream-Start: ";
      break;
    case Token::TK_StreamEnd:
      OS << "Stream-End: ";
      break;
    case Token::TK_VersionDirective:
      OS << "Version-Directive: ";
      break;
    case Token::TK_TagDirective:
      OS << "Tag-Directive: ";
      break;
    case Token::TK_DocumentStart:
      OS << "Document-Start: ";
      break;
    case Token::TK_DocumentEnd:
      OS << "Document-End: ";
      break;
    case Token::TK_BlockEntry:
      OS << "Block-Entry: ";
      break;
    case Token::TK_BlockEnd:
      OS << "Block-End: ";
      break;
    case Token::TK_BlockSequenceStart:
      OS << "Block-Sequence-Start: ";
      break;
    case Token::TK_BlockMappingStart:
      OS << "Block-Mapping-Start: ";
      break;
    case Token::TK_FlowEntry:
      OS << "Flow-Entry: ";
      break;
    case Token::TK_FlowSequenceStart:
      OS << "Flow-Sequence-Start: ";
      break;
    case Token::TK_FlowSequenceEnd:
      OS << "Flow-Sequence-End: ";
      break;
    case Token::TK_FlowMappingStart:
      OS << "Flow-Mapping-Start: ";
      break;
    case Token::TK_FlowMappingEnd:
      OS << "Flow-Mapping-End: ";
      break;
    case Token::TK_Key:
      OS << "Key: ";
      break;
    case Token::TK_Value:
      OS << "Value: ";
      break;
    case Token::TK_Scalar:
      OS << "Scalar: ";
      break;
    case Token::TK_BlockScalar:
      OS << "Block Scalar: ";
      break;
    case Token::TK_Alias:
      OS << "Alias: ";
      break;
    case Token::TK_Anchor:
      OS << "Anchor: ";
      break;
    case Token::TK_Tag:
      OS << "Tag: ";
      break;
    case Token::TK_Error:
      break;
    }
    OS << T.Range << "\n";
    if (T.Kind == Token::TK_StreamEnd)
      break;
    else if (T.Kind == Token::TK_Error)
      return false;
  }
  return true;
}